

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzerResults::GenFlagFieldString(HdlcAnalyzerResults *this,Frame *frame,bool tabular)

{
  long lVar1;
  char *local_28;
  char *flagTypeStr;
  bool tabular_local;
  Frame *frame_local;
  HdlcAnalyzerResults *this_local;
  
  local_28 = (char *)0x0;
  lVar1 = *(long *)(frame + 0x10);
  if (lVar1 == 0) {
    local_28 = "Start";
  }
  else if (lVar1 == 1) {
    local_28 = "End";
  }
  else if (lVar1 == 2) {
    local_28 = "Fill";
  }
  if (tabular) {
    AnalyzerResults::AddTabularText
              ((char *)this,local_28," Flag Delimiter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"F",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"FL",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"FLAG",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_28," FLAG",(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_28," Flag Delimiter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenFlagFieldString( const Frame& frame, bool tabular )
{
    char* flagTypeStr = 0;
    switch( frame.mData1 )
    {
    case HDLC_FLAG_START:
        flagTypeStr = "Start";
        break;
    case HDLC_FLAG_END:
        flagTypeStr = "End";
        break;
    case HDLC_FLAG_FILL:
        flagTypeStr = "Fill";
        break;
    }

    if( !tabular )
    {
        AddResultString( "F" );
        AddResultString( "FL" );
        AddResultString( "FLAG" );
        AddResultString( flagTypeStr, " FLAG" );
        AddResultString( flagTypeStr, " Flag Delimiter" );
    }
    else
        AddTabularText( flagTypeStr, " Flag Delimiter" );
}